

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O3

void __thiscall libtorrent::aux::packet_buffer::reserve(packet_buffer *this,uint32_t size)

{
  _Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  _Var1;
  undefined8 uVar2;
  void *__ptr;
  uint uVar3;
  uint uVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  _Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  __s;
  uint uVar9;
  
  uVar8 = this->m_capacity;
  uVar4 = 0x10;
  if (uVar8 != 0) {
    uVar4 = uVar8;
  }
  do {
    uVar3 = uVar4;
    uVar4 = uVar3 * 2;
  } while (uVar3 < size);
  uVar6 = (ulong)uVar3;
  puVar5 = (ulong *)operator_new__(uVar6 * 8 + 8);
  *puVar5 = uVar6;
  __s.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
        )(puVar5 + 1);
  if (uVar3 != 0) {
    memset((void *)__s.
                   super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                   ._M_head_impl,0,uVar6 << 3);
  }
  uVar4 = this->m_first;
  if (uVar4 < uVar4 + uVar8) {
    uVar9 = uVar4;
    do {
      uVar6 = (ulong)(uVar8 - 1 & uVar9);
      _Var1.
      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ._M_head_impl =
           (this->m_storage).
           super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           ._M_t.
           super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           .
           super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ;
      uVar7 = (ulong)(uVar9 & uVar3 - 1);
      uVar2 = *(undefined8 *)
               ((long)_Var1.
                      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                      ._M_head_impl + uVar6 * 8);
      *(undefined8 *)
       ((long)_Var1.
              super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
              ._M_head_impl + uVar6 * 8) = 0;
      __ptr = *(void **)((long)__s.
                               super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                               ._M_head_impl + uVar7 * 8);
      *(undefined8 *)
       ((long)__s.
              super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
              ._M_head_impl + uVar7 * 8) = uVar2;
      if (__ptr != (void *)0x0) {
        free(__ptr);
        uVar8 = this->m_capacity;
        uVar4 = this->m_first;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar4 + uVar8);
  }
  _Var1.
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (this->m_storage).
       super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       ._M_t.
       super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
       .
       super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ;
  (this->m_storage).
  super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
       = __s.
         super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         ._M_head_impl;
  if (_Var1.
      super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
      ._M_head_impl != (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0)
  {
    ::std::
    default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>::
    operator()((default_delete<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>[]>
                *)this,(unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
                       _Var1.
                       super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
                       ._M_head_impl);
  }
  this->m_capacity = uVar3;
  return;
}

Assistant:

void packet_buffer::reserve(std::uint32_t size)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT_VAL(size <= 0xffff, size);
		std::uint32_t new_size = m_capacity == 0 ? 16 : m_capacity;

		while (new_size < size)
			new_size <<= 1;

		aux::unique_ptr<packet_ptr[], index_type> new_storage(new packet_ptr[new_size]);

		for (index_type i = m_first; i < (m_first + m_capacity); ++i)
			new_storage[i & (new_size - 1)] = std::move(m_storage[i & (m_capacity - 1)]);

		m_storage = std::move(new_storage);
		m_capacity = new_size;
	}